

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ObjFaninC2(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint *puVar1;
  int iVar2;
  bool local_19;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  local_19 = false;
  if (p->pMuxes != (uint *)0x0) {
    puVar1 = p->pMuxes;
    iVar2 = Gia_ObjId(p,pObj);
    iVar2 = Abc_LitIsCompl(puVar1[iVar2]);
    local_19 = iVar2 != 0;
  }
  return (int)local_19;
}

Assistant:

static inline int          Gia_ObjFaninC2( Gia_Man_t * p, Gia_Obj_t * pObj )   { return p->pMuxes && Abc_LitIsCompl(p->pMuxes[Gia_ObjId(p, pObj)]);  }